

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall BPlusTree<long>::clear_tree(BPlusTree<long> *this)

{
  Array<BPlusTree<long>_*> *this_00;
  BPlusTree<long> *this_01;
  BPlusTree<long> **ppBVar1;
  size_t index;
  
  if (this->subset_size != 0) {
    this_00 = &this->subset;
    index = 0;
    do {
      ppBVar1 = b_array::Array<BPlusTree<long>_*>::operator[](this_00,index);
      if (*ppBVar1 != (BPlusTree<long> *)0x0) {
        ppBVar1 = b_array::Array<BPlusTree<long>_*>::operator[](this_00,index);
        clear_tree(*ppBVar1);
        ppBVar1 = b_array::Array<BPlusTree<long>_*>::operator[](this_00,index);
        this_01 = *ppBVar1;
        if (this_01 != (BPlusTree<long> *)0x0) {
          ~BPlusTree(this_01);
          operator_delete(this_01);
        }
        ppBVar1 = b_array::Array<BPlusTree<long>_*>::operator[](this_00,index);
        *ppBVar1 = (BPlusTree<long> *)0x0;
      }
      index = index + 1;
    } while (index < this->subset_size);
  }
  erase_node(this);
  return;
}

Assistant:

void BPlusTree<T>::clear_tree() {
    for (size_t i = 0; i < subset_size; ++i) {
        if (subset[i] != nullptr) {
            subset[i]->clear_tree();
            delete subset[i];
            subset[i] = nullptr;
        }
    }
    erase_node();
}